

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O3

Am_Object find_obj_slot(int x,int y,Am_Object *ref_obj,bool source,Am_Slot_Key *slot,Places *place)

{
  undefined2 uVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  Am_Value *pAVar5;
  ostream *poVar6;
  long *plVar7;
  undefined7 in_register_00000009;
  Am_Slot_Key *pAVar8;
  undefined4 in_register_0000003c;
  Am_Object AVar9;
  Am_Object obj;
  Am_Value v;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Places *local_48;
  Am_Value local_40;
  
  local_48 = place;
  Am_Point_In_Part(&local_70,0x111480,y,(Am_Object *)((ulong)ref_obj & 0xffffffff),source,false);
  local_40.type = 0;
  local_40.value.wrapper_value = (Am_Wrapper *)0x0;
  cVar2 = Am_Object::Valid();
  if (cVar2 == '\0') {
LAB_00106614:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"** Wrong type obj for wire: ",0x1c);
    plVar7 = (long *)operator<<((ostream *)&std::cout,&local_70);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  }
  else {
    Am_Object::Am_Object(&local_50,&circuit_object_proto);
    AVar9.data = (Am_Object_Data *)&local_70;
    cVar2 = Am_Object::Is_Instance_Of(AVar9);
    Am_Object::~Am_Object(&local_50);
    if (cVar2 == '\0') goto LAB_00106614;
    if ((char)slot != '\0') {
      *(Am_Slot_Key *)local_48 = OUTPUT_1;
      *(undefined4 *)obj.data = 3;
      goto LAB_0010669b;
    }
    Am_Object::Am_Object(&local_68,&zero_one_proto);
    cVar2 = Am_Object::Is_Instance_Of((Am_Object_Data *)&local_70);
    if (cVar2 == '\0') {
      Am_Object::Am_Object(&local_58,&not_proto);
      cVar2 = Am_Object::Is_Instance_Of((Am_Object_Data *)&local_70);
      Am_Object::~Am_Object(&local_58);
      Am_Object::~Am_Object(&local_68);
      if (cVar2 != '\0') goto LAB_00106738;
      bVar3 = is_at_top((int)ref_obj,(Am_Object *)CONCAT71(in_register_00000009,source),&local_70);
      pAVar8 = &INPUT_2;
      if (bVar3) {
        pAVar8 = &INPUT_1;
      }
      iVar4 = 2 - (uint)bVar3;
    }
    else {
      Am_Object::~Am_Object(&local_68);
LAB_00106738:
      iVar4 = 0;
      pAVar8 = &INPUT_1;
    }
    uVar1 = *pAVar8;
    *(undefined2 *)local_48 = uVar1;
    *(int *)obj.data = iVar4;
    AVar9.data = (Am_Object_Data *)&local_70;
    pAVar5 = (Am_Value *)Am_Object::Get((ushort)AVar9.data,(ulong)(ushort)uVar1);
    Am_Value::operator=(&local_40,pAVar5);
    cVar2 = Am_Value::Valid();
    if (cVar2 == '\0') goto LAB_0010669b;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"** Object at output end ",0x18);
    poVar6 = (ostream *)operator<<((ostream *)&std::cout,&local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," already has another object as input= ",0x26);
    plVar7 = (long *)operator<<(poVar6,&local_70);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  }
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::ostream::flush();
  Am_Object::Am_Object(&local_60,&circuit_win);
  Am_Beep((Am_Object_Data *)&local_60);
  Am_Object::~Am_Object(&local_60);
  AVar9.data = (Am_Object_Data *)&Am_No_Object;
LAB_0010669b:
  Am_Object::Am_Object((Am_Object *)CONCAT44(in_register_0000003c,x),(Am_Object *)AVar9.data);
  Am_Value::~Am_Value(&local_40);
  Am_Object::~Am_Object(&local_70);
  return (Am_Object)(Am_Object_Data *)CONCAT44(in_register_0000003c,x);
}

Assistant:

Am_Object find_obj_slot(int x, int y, Am_Object &ref_obj, bool source,
			Am_Slot_Key &slot, Places &place) {
  Am_Object obj = Am_Point_In_Part(created_objs, x, y, ref_obj);
  Am_Value v;
  if (obj.Valid() && obj.Is_Instance_Of(circuit_object_proto)) {
    if (source) {
      slot = OUTPUT_1;
      place = center_right;
      return obj;
    }
    else { // is destination
      if (obj.Is_Instance_Of(zero_one_proto) ||
	  obj.Is_Instance_Of(not_proto)) {
	slot = INPUT_1;
	place = center_left;
      }
      else {
	if (is_at_top(y, ref_obj, obj)) {
	  slot = INPUT_1;
	  place = top_left;
	}
	else {
	  slot = INPUT_2;
	  place = bottom_left;
	}
      }
      // destinations can only have one per place
      v = obj.Peek(slot);
      if (v.Valid()) 
	cout << "** Object at output end " << obj
	     << " already has another object as input= " << obj
	     << endl << flush;
      else return obj;
    }
  }
  else cout << "** Wrong type obj for wire: " << obj << endl << flush;
  //if get here, then failed
  Am_Beep(circuit_win);
  return Am_No_Object;
}